

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

void gimage::rgbToHSV<unsigned_short,gimage::PixelTraits<unsigned_short>>
               (ImageFloat *ret,Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *image)

{
  work_t wVar1;
  work_t wVar2;
  work_t wVar3;
  work_t v;
  float *sat_00;
  long lVar4;
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *in_RSI;
  float *in_RDI;
  Image<float,_gimage::PixelTraits<float>_> *unaff_retaddr;
  long i;
  long k;
  float val;
  float sat;
  float hue;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  long lVar5;
  Image<float,_gimage::PixelTraits<float>_> *this;
  Image<float,_gimage::PixelTraits<float>_> *hue_00;
  long local_28;
  int in_stack_ffffffffffffffe0;
  long in_stack_ffffffffffffffe8;
  float *w;
  
  w = in_RDI;
  sat_00 = (float *)Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(in_RSI);
  Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(in_RSI);
  Image<float,_gimage::PixelTraits<float>_>::setSize
            (unaff_retaddr,(long)w,(long)in_RSI,in_stack_ffffffffffffffe8);
  local_28 = 0;
  while( true ) {
    lVar5 = local_28;
    lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getHeight(in_RSI);
    if (lVar4 <= lVar5) break;
    this = (Image<float,_gimage::PixelTraits<float>_> *)0x0;
    while( true ) {
      hue_00 = this;
      lVar4 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getWidth(in_RSI);
      if (lVar4 <= (long)this) break;
      wVar1 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getW
                        (in_RSI,(long)hue_00,local_28,0);
      wVar2 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getW
                        (in_RSI,(long)hue_00,local_28,1);
      wVar3 = Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::getW
                        (in_RSI,(long)hue_00,local_28,2);
      v = (work_t)Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::absMaxValue
                            ((Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *)0x15f052
                            );
      rgbToHSV<int>((float *)hue_00,sat_00,in_RDI,(int)((ulong)lVar5 >> 0x20),(int)lVar5,
                    (int)((ulong)this >> 0x20),in_stack_ffffffffffffffe0);
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar3,wVar2),CONCAT44(wVar1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,v);
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar3,wVar2),CONCAT44(wVar1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,v);
      Image<float,_gimage::PixelTraits<float>_>::setLimited
                (this,CONCAT44(wVar3,wVar2),CONCAT44(wVar1,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c,v);
      this = (Image<float,_gimage::PixelTraits<float>_> *)((long)&hue_00->depth + 1);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void rgbToHSV(ImageFloat &ret, const Image<T, traits> &image)
{
  float hue, sat, val;

  assert(image.getDepth() == 3);

  ret.setSize(image.getWidth(), image.getHeight(), 3);

  for (long k=0; k<image.getHeight(); k++)
  {
    for (long i=0; i<image.getWidth(); i++)
    {
      rgbToHSV(hue, sat, val, image.getW(i, k, 0), image.getW(i, k, 1),
               image.getW(i, k, 2), image.absMaxValue());

      ret.setLimited(i, k, 0, hue);
      ret.setLimited(i, k, 1, sat);
      ret.setLimited(i, k, 2, val);
    }
  }
}